

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.hpp
# Opt level: O1

uint8_t duckdb::StringUtil::GetHexValue(char c)

{
  InvalidInputException *this;
  char cVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  
  cVar1 = -0x30;
  if ((9 < (byte)(c - 0x30U)) && (cVar1 = -0x57, 5 < (byte)(c + 0x9fU))) {
    cVar1 = -0x37;
    if (5 < (byte)(c + 0xbfU)) {
      this = (InvalidInputException *)__cxa_allocate_exception(0x10);
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,"Invalid input for hex digit: %s","");
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      ::std::__cxx11::string::_M_construct((ulong)&local_68,'\x01');
      InvalidInputException::InvalidInputException<std::__cxx11::string>(this,&local_48,&local_68);
      __cxa_throw(this,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  return cVar1 + c;
}

Assistant:

static uint8_t GetHexValue(char c) {
		if (c >= '0' && c <= '9') {
			return UnsafeNumericCast<uint8_t>(c - '0');
		}
		if (c >= 'a' && c <= 'f') {
			return UnsafeNumericCast<uint8_t>(c - 'a' + 10);
		}
		if (c >= 'A' && c <= 'F') {
			return UnsafeNumericCast<uint8_t>(c - 'A' + 10);
		}
		throw InvalidInputException("Invalid input for hex digit: %s", string(1, c));
	}